

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::AtomicUsageTest<glcts::ArraysOfArrays::Interface::GL>::execute
          (AtomicUsageTest<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type,GLuint binding,GLuint offset,GLuint n_entries)

{
  code *pcVar1;
  char *__s;
  size_t sVar2;
  int iVar3;
  deUint32 dVar4;
  value_type vVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  reference pvVar8;
  TestError *pTVar9;
  reference pvVar10;
  long lVar11;
  ulong local_268;
  size_t i_3;
  ulong uStack_258;
  int diff;
  size_t i_2;
  GLuint *results;
  undefined4 uStack_240;
  bool test_result;
  GLuint vao_id;
  GLuint texture_object_id;
  GLuint framebuffer_object_id;
  size_t i_1;
  size_t buffer_data_size;
  size_t last_pos;
  size_t start_pos;
  vector<unsigned_int,_std::allocator<unsigned_int>_> buffer_data;
  undefined1 *puStack_1f8;
  GLuint buffer_object_id;
  string *fs;
  string *gs;
  string *tes;
  string *tcs;
  string *vs;
  string *cs;
  char max_1 [16];
  char max [16];
  char it [16];
  long local_190;
  size_t i;
  char buffer [16];
  string varying_definition;
  string valid_iteration;
  allocator<char> local_121;
  string local_120 [8];
  string valid_definition;
  string valid_shader_source;
  string result;
  string loop_end;
  string indexing;
  string indent;
  vector<unsigned_long,_std::allocator<unsigned_long>_> dimensions;
  string comment;
  Functions *gl;
  GLuint n_entries_local;
  GLuint offset_local;
  GLuint binding_local;
  TestShaderType tested_shader_type_local;
  AtomicUsageTest<glcts::ArraysOfArrays::Interface::GL> *this_local;
  long lVar7;
  
  pRVar6 = deqp::Context::getRenderContext
                     ((this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).context_id);
  iVar3 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  std::__cxx11::string::string
            ((string *)
             &dimensions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)((long)&indent.field_2 + 8));
  std::__cxx11::string::string((string *)(indexing.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(loop_end.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(result.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(valid_shader_source.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(valid_definition.field_2._M_local_buf + 8));
  __s = execute::layout_binding;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_120,__s,&local_121);
  std::allocator<char>::~allocator(&local_121);
  std::__cxx11::string::string((string *)(varying_definition.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(buffer + 8));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)((long)&indent.field_2 + 8),8)
  ;
  prepareDimensions<glcts::ArraysOfArrays::Interface::GL>
            ((ulong)n_entries,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)((long)&indent.field_2 + 8));
  sprintf((char *)&i,"%u",(ulong)binding);
  std::__cxx11::string::operator+=(local_120,(char *)&i);
  std::__cxx11::string::operator+=(local_120,execute::layout_offset);
  sprintf((char *)&i,"%u",(ulong)offset);
  std::__cxx11::string::operator+=(local_120,(char *)&i);
  std::__cxx11::string::operator+=(local_120,execute::uniform_atomic_uint);
  for (local_190 = 8; local_190 != 0; local_190 = local_190 + -1) {
    std::__cxx11::string::operator+=
              ((string *)(indexing.field_2._M_local_buf + 8),execute::indent_step);
    std::__cxx11::string::insert((ulong)((long)&result.field_2 + 8),(char *)0x0);
    std::__cxx11::string::insert((ulong)((long)&result.field_2 + 8),(string *)0x0);
    sprintf(max + 8,"i%u",(ulong)(8 - (int)local_190));
    std::__cxx11::string::operator+=((string *)(loop_end.field_2._M_local_buf + 8),"[");
    std::__cxx11::string::operator+=((string *)(loop_end.field_2._M_local_buf + 8),max + 8);
    std::__cxx11::string::operator+=((string *)(loop_end.field_2._M_local_buf + 8),"]");
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        ((long)&indent.field_2 + 8),local_190 - 1);
    sprintf(max_1 + 8,"%u",(ulong)(uint)*pvVar8);
    std::__cxx11::string::operator+=(local_120,"[");
    std::__cxx11::string::operator+=(local_120,max_1 + 8);
    std::__cxx11::string::operator+=(local_120,"]");
    std::__cxx11::string::operator+=
              ((string *)(varying_definition.field_2._M_local_buf + 8),
               (string *)(indexing.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=
              ((string *)(varying_definition.field_2._M_local_buf + 8),"for (uint ");
    std::__cxx11::string::operator+=
              ((string *)(varying_definition.field_2._M_local_buf + 8),max + 8);
    std::__cxx11::string::operator+=
              ((string *)(varying_definition.field_2._M_local_buf + 8)," = 0; ");
    std::__cxx11::string::operator+=
              ((string *)(varying_definition.field_2._M_local_buf + 8),max + 8);
    std::__cxx11::string::operator+=((string *)(varying_definition.field_2._M_local_buf + 8)," < ");
    std::__cxx11::string::operator+=
              ((string *)(varying_definition.field_2._M_local_buf + 8),max_1 + 8);
    std::__cxx11::string::operator+=((string *)(varying_definition.field_2._M_local_buf + 8),"; ++")
    ;
    std::__cxx11::string::operator+=
              ((string *)(varying_definition.field_2._M_local_buf + 8),max + 8);
    std::__cxx11::string::operator+=((string *)(varying_definition.field_2._M_local_buf + 8),")\n");
    std::__cxx11::string::operator+=
              ((string *)(varying_definition.field_2._M_local_buf + 8),
               (string *)(indexing.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)(varying_definition.field_2._M_local_buf + 8),"{\n");
  }
  sprintf((char *)&cs,"%u",(ulong)n_entries);
  std::__cxx11::string::operator+=
            ((string *)
             &dimensions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,"/* Number of atomic counters = ");
  std::__cxx11::string::operator+=
            ((string *)
             &dimensions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(char *)&cs);
  std::__cxx11::string::operator+=
            ((string *)
             &dimensions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage," */\n");
  switch(tested_shader_type) {
  case FRAGMENT_SHADER_TYPE:
    std::__cxx11::string::operator=
              ((string *)(valid_shader_source.field_2._M_local_buf + 8),
               "    color = vec4(result);\n");
    std::__cxx11::string::operator=((string *)(buffer + 8),"out vec4 color;\n\n");
    break;
  case VERTEX_SHADER_TYPE:
    std::__cxx11::string::operator=
              ((string *)(valid_shader_source.field_2._M_local_buf + 8),"    fs_result = result;\n")
    ;
    std::__cxx11::string::operator=((string *)(buffer + 8),"out float fs_result;\n\n");
    break;
  case COMPUTE_SHADER_TYPE:
    std::__cxx11::string::operator=
              ((string *)(valid_shader_source.field_2._M_local_buf + 8),
               "    imageStore(uni_image, ivec2(gl_GlobalInvocationID.xy), vec4(result, 0, 0, 0));\n"
              );
    std::__cxx11::string::operator=
              ((string *)(buffer + 8),"writeonly uniform image2D uni_image;\n\n");
    break;
  case GEOMETRY_SHADER_TYPE:
    std::__cxx11::string::operator=
              ((string *)(valid_shader_source.field_2._M_local_buf + 8),
               "    gl_Position  = vec4(-1, -1, 0, 1);\n    fs_result = result;\n    EmitVertex();\n    gl_Position  = vec4(-1, 1, 0, 1);\n    fs_result = result;\n    EmitVertex();\n    gl_Position  = vec4(1, -1, 0, 1);\n    fs_result = result;\n    EmitVertex();\n    gl_Position  = vec4(1, 1, 0, 1);\n    fs_result = result;\n    EmitVertex();\n"
              );
    std::__cxx11::string::operator=((string *)(buffer + 8),"out float fs_result;\n\n");
    break;
  case TESSELATION_CONTROL_SHADER_TYPE:
    std::__cxx11::string::operator=
              ((string *)(valid_shader_source.field_2._M_local_buf + 8),
               "    tcs_result[gl_InvocationID] = result;\n\n    gl_TessLevelOuter[0] = 1.0;\n    gl_TessLevelOuter[1] = 1.0;\n    gl_TessLevelOuter[2] = 1.0;\n    gl_TessLevelOuter[3] = 1.0;\n    gl_TessLevelInner[0] = 1.0;\n    gl_TessLevelInner[1] = 1.0;\n"
              );
    std::__cxx11::string::operator=((string *)(buffer + 8),"out float tcs_result[];\n\n");
    break;
  case TESSELATION_EVALUATION_SHADER_TYPE:
    std::__cxx11::string::operator=
              ((string *)(valid_shader_source.field_2._M_local_buf + 8),"    fs_result = result;\n")
    ;
    std::__cxx11::string::operator=((string *)(buffer + 8),"out float fs_result;\n\n");
    break;
  default:
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar9,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x213b);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::__cxx11::string::operator+=
            ((string *)(valid_definition.field_2._M_local_buf + 8),(string *)(buffer + 8));
  std::__cxx11::string::operator+=
            ((string *)(valid_definition.field_2._M_local_buf + 8),
             (string *)
             &dimensions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::operator+=((string *)(valid_definition.field_2._M_local_buf + 8),local_120);
  std::__cxx11::string::operator+=
            ((string *)(valid_definition.field_2._M_local_buf + 8),
             " a;\n\nvoid main()\n{\n    uint sum = 0u;\n");
  std::__cxx11::string::operator+=
            ((string *)(valid_definition.field_2._M_local_buf + 8),
             (string *)(varying_definition.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=
            ((string *)(valid_definition.field_2._M_local_buf + 8),
             (string *)(indexing.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=
            ((string *)(valid_definition.field_2._M_local_buf + 8),execute::indent_step);
  std::__cxx11::string::operator+=
            ((string *)(valid_definition.field_2._M_local_buf + 8),
             "sum += atomicCounterIncrement( a");
  std::__cxx11::string::operator+=
            ((string *)(valid_definition.field_2._M_local_buf + 8),
             (string *)(loop_end.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=((string *)(valid_definition.field_2._M_local_buf + 8)," );\n");
  std::__cxx11::string::operator+=
            ((string *)(valid_definition.field_2._M_local_buf + 8),
             (string *)(result.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=
            ((string *)(valid_definition.field_2._M_local_buf + 8),
             "\n    float result = 0.0;\n\n    if (16u < sum)\n    {\n         result = 1.0;\n    }\n"
            );
  std::__cxx11::string::operator+=
            ((string *)(valid_definition.field_2._M_local_buf + 8),
             (string *)(valid_shader_source.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=
            ((string *)(valid_definition.field_2._M_local_buf + 8),(string *)shader_end_abi_cxx11_);
  vs = (string *)empty_string_abi_cxx11_;
  tcs = (string *)default_vertex_shader_source_abi_cxx11_;
  tes = (string *)empty_string_abi_cxx11_;
  gs = (string *)empty_string_abi_cxx11_;
  fs = (string *)empty_string_abi_cxx11_;
  puStack_1f8 = pass_fragment_shader_source_abi_cxx11_;
  switch(tested_shader_type) {
  case FRAGMENT_SHADER_TYPE:
    puStack_1f8 = (undefined1 *)((long)&valid_definition.field_2 + 8);
    break;
  case VERTEX_SHADER_TYPE:
    tcs = (string *)((long)&valid_definition.field_2 + 8);
    break;
  case COMPUTE_SHADER_TYPE:
    vs = (string *)((long)&valid_definition.field_2 + 8);
    tcs = (string *)empty_string_abi_cxx11_;
    puStack_1f8 = empty_string_abi_cxx11_;
    break;
  case GEOMETRY_SHADER_TYPE:
    fs = (string *)((long)&valid_definition.field_2 + 8);
    break;
  case TESSELATION_CONTROL_SHADER_TYPE:
    tes = (string *)((long)&valid_definition.field_2 + 8);
    gs = (string *)pass_te_shader_source_abi_cxx11_;
    break;
  case TESSELATION_EVALUATION_SHADER_TYPE:
    tes = (string *)default_tc_shader_source_abi_cxx11_;
    gs = (string *)((long)&valid_definition.field_2 + 8);
    break;
  default:
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar9,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x217d);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[10])(this,tcs,tes,gs,fs,puStack_1f8,vs,0,0);
  (**(code **)(lVar7 + 0x1680))
            ((this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).program_object_id);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glUseProgram() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x218c);
  buffer_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&start_pos);
  last_pos = (size_t)(offset >> 2);
  buffer_data_size = last_pos + n_entries;
  i_1 = buffer_data_size * 4;
  (**(code **)(lVar7 + 0x6c8))
            (1,(undefined1 *)
               ((long)&buffer_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glGenBuffers() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x2196);
  (**(code **)(lVar7 + 0x40))
            (0x92c0,buffer_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glBindBuffer() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x2199);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&start_pos,last_pos + n_entries)
  ;
  for (_texture_object_id = 0; sVar2 = i_1, _texture_object_id < n_entries;
      _texture_object_id = _texture_object_id + 1) {
    vVar5 = (value_type)_texture_object_id;
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&start_pos,
                         last_pos + _texture_object_id);
    *pvVar10 = vVar5;
  }
  pcVar1 = *(code **)(lVar7 + 0x150);
  pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&start_pos,0);
  (*pcVar1)(0x92c0,sVar2,pvVar10,0x88e4);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glBufferData() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x21a2);
  (**(code **)(lVar7 + 0x48))
            (0x92c0,binding,
             buffer_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glBindBufferBase() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x21a5);
  if (tested_shader_type == COMPUTE_SHADER_TYPE) {
    (**(code **)(lVar7 + 0x528))(1,1);
    dVar4 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar4,"glDrawArrays() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x21ef);
    (**(code **)(lVar7 + 0xdb8))(0xffffffff);
    dVar4 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar4,"MemoryBarrier.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x21f2);
  }
  else {
    vao_id = 0;
    uStack_240 = 0;
    results._4_4_ = 0;
    (**(code **)(lVar7 + 0x6f8))(1,&stack0xfffffffffffffdc0);
    dVar4 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar4,"glGenTextures() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x21af);
    (**(code **)(lVar7 + 0xb8))(0xde1,uStack_240);
    dVar4 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar4,"glBindTexture() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x21b2);
    (**(code **)(lVar7 + 0x1380))(0xde1,1,0x8058,1);
    dVar4 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar4,"glTexStorage2D() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x21b5);
    (**(code **)(lVar7 + 0x6d0))(1,&vao_id);
    dVar4 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar4,"glGenFramebuffers() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x21b8);
    (**(code **)(lVar7 + 0x78))(0x8d40,vao_id);
    dVar4 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar4,"glBindFramebuffer() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x21bb);
    (**(code **)(lVar7 + 0x6a0))(0x8d40,0x8ce0,0xde1,uStack_240,0);
    dVar4 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar4,"glFramebufferTexture2D() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x21be);
    (**(code **)(lVar7 + 0x1a00))(0,0,1);
    dVar4 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar4,"glViewport() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x21c1);
    (**(code **)(lVar7 + 0x708))(1,(long)&results + 4);
    dVar4 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar4,"glGenVertexArrays() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x21c4);
    (**(code **)(lVar7 + 0xd8))(results._4_4_);
    dVar4 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar4,"glBindVertexArray() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x21c7);
    if ((tested_shader_type < COMPUTE_SHADER_TYPE) || (tested_shader_type == GEOMETRY_SHADER_TYPE))
    {
      (**(code **)(lVar7 + 0x538))(0,0,1);
      dVar4 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar4,"glDrawArrays() failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x21cf);
    }
    else {
      if (1 < tested_shader_type - TESSELATION_CONTROL_SHADER_TYPE) {
        pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar9,"Invalid enum",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,0x21dd);
        __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      (**(code **)(lVar7 + 0xfd8))(0x8e72,1);
      dVar4 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar4,"PatchParameteri",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x21d6);
      (**(code **)(lVar7 + 0x538))(0xe,0,1);
      dVar4 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar4,"glDrawArrays() failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x21d9);
    }
    (**(code **)(lVar7 + 0xdb8))(0xffffffff);
    dVar4 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar4,"MemoryBarrier.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x21e2);
    (**(code **)(lVar7 + 0xb8))(0xde1,0);
    (**(code **)(lVar7 + 0x78))(0x8d40,0);
    (**(code **)(lVar7 + 0xd8))(0);
    (**(code **)(lVar7 + 0x480))(1,&stack0xfffffffffffffdc0);
    (**(code **)(lVar7 + 0x440))(1,&vao_id);
    (**(code **)(lVar7 + 0x490))(1,(long)&results + 4);
    dVar4 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar4,"An error ocurred while deleting generated objects.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x21ea);
  }
  results._3_1_ = 1;
  lVar11 = (**(code **)(lVar7 + 0xd00))(0x92c0,0,i_1,1);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"MapBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x21fa);
  for (uStack_258 = 0; uStack_258 < last_pos; uStack_258 = uStack_258 + 1) {
    if (*(int *)(lVar11 + uStack_258 * 4) != 0) {
      results._3_1_ = 0;
      break;
    }
  }
  i_3._4_4_ = 0;
  local_268 = 0;
  do {
    if (n_entries <= local_268) {
LAB_01302225:
      (**(code **)(lVar7 + 0x1670))(0x92c0);
      dVar4 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar4,"UnmapBuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x2229);
      (**(code **)(lVar7 + 0x438))
                (1,(undefined1 *)
                   ((long)&buffer_data.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 4));
      (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
        super_TestNode._vptr_TestNode[5])();
      if ((results._3_1_ & 1) != 0) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&start_pos);
        std::__cxx11::string::~string((string *)(buffer + 8));
        std::__cxx11::string::~string((string *)(varying_definition.field_2._M_local_buf + 8));
        std::__cxx11::string::~string(local_120);
        std::__cxx11::string::~string((string *)(valid_definition.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(valid_shader_source.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(result.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(loop_end.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(indexing.field_2._M_local_buf + 8));
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   ((long)&indent.field_2 + 8));
        std::__cxx11::string::~string
                  ((string *)
                   &dimensions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        return;
      }
      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar9,"Invalid results.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x2231);
      __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    if (tested_shader_type == TESSELATION_EVALUATION_SHADER_TYPE) {
      if (local_268 == 0) {
        i_3._4_4_ = *(int *)(lVar11 + last_pos * 4) - (int)local_268;
        if (i_3._4_4_ < 1) {
          results._3_1_ = 0;
          goto LAB_01302225;
        }
      }
      else if (*(int *)(lVar11 + (local_268 + last_pos) * 4) - (int)local_268 != i_3._4_4_) {
        results._3_1_ = 0;
        goto LAB_01302225;
      }
    }
    else if (local_268 + 1 != (ulong)*(uint *)(lVar11 + (local_268 + last_pos) * 4)) {
      results._3_1_ = 0;
      goto LAB_01302225;
    }
    local_268 = local_268 + 1;
  } while( true );
}

Assistant:

void AtomicUsageTest<API>::execute(typename TestCaseBase<API>::TestShaderType tested_shader_type, glw::GLuint binding,
								   glw::GLuint offset, glw::GLuint n_entries)
{
	static const char* indent_step		   = "    ";
	static const char* layout_binding	  = "layout(binding = ";
	static const char* layout_offset	   = ", offset = ";
	static const char* uniform_atomic_uint = ") uniform atomic_uint";

	const glw::Functions& gl = this->context_id.getRenderContext().getFunctions();

	std::string			comment;
	std::vector<size_t> dimensions;
	std::string			indent;
	std::string			indexing;
	std::string			loop_end;
	std::string			result;
	std::string			valid_shader_source;
	std::string			valid_definition = layout_binding;
	std::string			valid_iteration;
	std::string			varying_definition;

	dimensions.resize(API::MAX_ARRAY_DIMENSIONS);
	prepareDimensions<API>(n_entries, dimensions);

	/* Prepare parts of shader */

	/* Append binding */
	{
		char buffer[16];
		sprintf(buffer, "%u", static_cast<unsigned int>(binding));
		valid_definition += buffer;
		valid_definition += layout_offset;
		sprintf(buffer, "%u", static_cast<unsigned int>(offset));
		valid_definition += buffer;
		valid_definition += uniform_atomic_uint;
	}

	for (size_t i = API::MAX_ARRAY_DIMENSIONS; i != 0; --i)
	{
		char it[16];
		char max[16];

		indent += indent_step;

		loop_end.insert(0, "}\n");
		loop_end.insert(0, indent);

		sprintf(it, "i%u", (unsigned int)(API::MAX_ARRAY_DIMENSIONS - i));

		indexing += "[";
		indexing += it;
		indexing += "]";

		sprintf(max, "%u", (unsigned int)(dimensions[i - 1]));
		valid_definition += "[";
		valid_definition += max;
		valid_definition += "]";

		valid_iteration += indent;
		valid_iteration += "for (uint ";
		valid_iteration += it;
		valid_iteration += " = 0; ";
		valid_iteration += it;
		valid_iteration += " < ";
		valid_iteration += max;
		valid_iteration += "; ++";
		valid_iteration += it;
		valid_iteration += ")\n";
		valid_iteration += indent;
		valid_iteration += "{\n";
	}

	{
		char max[16];

		sprintf(max, "%u", (unsigned int)(n_entries));
		comment += "/* Number of atomic counters = ";
		comment += max;
		comment += " */\n";
	}

	/* Select varyings and result */
	switch (tested_shader_type)
	{
	case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
		result			   = "    imageStore(uni_image, ivec2(gl_GlobalInvocationID.xy), vec4(result, 0, 0, 0));\n";
		varying_definition = "writeonly uniform image2D uni_image;\n"
							 "\n";
		break;

	case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
		result			   = "    color = vec4(result);\n";
		varying_definition = "out vec4 color;\n"
							 "\n";
		break;

	case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
		result = "    gl_Position  = vec4(-1, -1, 0, 1);\n"
				 "    fs_result = result;\n"
				 "    EmitVertex();\n"
				 "    gl_Position  = vec4(-1, 1, 0, 1);\n"
				 "    fs_result = result;\n"
				 "    EmitVertex();\n"
				 "    gl_Position  = vec4(1, -1, 0, 1);\n"
				 "    fs_result = result;\n"
				 "    EmitVertex();\n"
				 "    gl_Position  = vec4(1, 1, 0, 1);\n"
				 "    fs_result = result;\n"
				 "    EmitVertex();\n";
		varying_definition = "out float fs_result;\n"
							 "\n";
		break;

	case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE:
		result = "    tcs_result[gl_InvocationID] = result;\n"
				 "\n"
				 "    gl_TessLevelOuter[0] = 1.0;\n"
				 "    gl_TessLevelOuter[1] = 1.0;\n"
				 "    gl_TessLevelOuter[2] = 1.0;\n"
				 "    gl_TessLevelOuter[3] = 1.0;\n"
				 "    gl_TessLevelInner[0] = 1.0;\n"
				 "    gl_TessLevelInner[1] = 1.0;\n";
		varying_definition = "out float tcs_result[];\n"
							 "\n";
		break;

	case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
		result			   = "    fs_result = result;\n";
		varying_definition = "out float fs_result;\n"
							 "\n";
		break;

	case TestCaseBase<API>::VERTEX_SHADER_TYPE:
		result			   = "    fs_result = result;\n";
		varying_definition = "out float fs_result;\n"
							 "\n";
		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	};

	/* Prepare valid source */
	valid_shader_source += varying_definition;
	valid_shader_source += comment;
	valid_shader_source += valid_definition;
	valid_shader_source += " a;\n\nvoid main()\n{\n    uint sum = 0u;\n";
	valid_shader_source += valid_iteration;
	valid_shader_source += indent;
	valid_shader_source += indent_step;
	valid_shader_source += "sum += atomicCounterIncrement( a";
	valid_shader_source += indexing;
	valid_shader_source += " );\n";
	valid_shader_source += loop_end;
	valid_shader_source += "\n"
						   "    float result = 0.0;\n"
						   "\n"
						   "    if (16u < sum)\n"
						   "    {\n"
						   "         result = 1.0;\n"
						   "    }\n";
	valid_shader_source += result;
	valid_shader_source += shader_end;

	/* Build program */
	{
		const std::string* cs  = &empty_string;
		const std::string* vs  = &default_vertex_shader_source;
		const std::string* tcs = &empty_string;
		const std::string* tes = &empty_string;
		const std::string* gs  = &empty_string;
		const std::string* fs  = &pass_fragment_shader_source;

		switch (tested_shader_type)
		{
		case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
			cs = &valid_shader_source;
			vs = &empty_string;
			fs = &empty_string;
			break;

		case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
			fs = &valid_shader_source;
			break;

		case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
			gs = &valid_shader_source;
			break;

		case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE:
			tcs = &valid_shader_source;
			tes = &pass_te_shader_source;
			break;

		case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
			tcs = &default_tc_shader_source;
			tes = &valid_shader_source;
			break;

		case TestCaseBase<API>::VERTEX_SHADER_TYPE:
			vs = &valid_shader_source;
			break;

		default:
			TCU_FAIL("Invalid enum");
			break;
		};

		if (API::USE_ALL_SHADER_STAGES)
		{
			this->execute_positive_test(*vs, *tcs, *tes, *gs, *fs, *cs, false, false);
		}
		else
		{
			this->execute_positive_test(*vs, *fs, false, false);
		}
	}

	gl.useProgram(this->program_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed.");

	/* Prepare buffer */
	glw::GLuint				 buffer_object_id = 0;
	std::vector<glw::GLuint> buffer_data;
	const size_t			 start_pos		  = offset / 4;
	const size_t			 last_pos		  = start_pos + n_entries;
	const size_t			 buffer_data_size = last_pos * sizeof(glw::GLuint);

	gl.genBuffers(1, &buffer_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() failed.");

	gl.bindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed.");

	buffer_data.resize(start_pos + n_entries);
	for (size_t i = 0; i < n_entries; ++i)
	{
		buffer_data[start_pos + i] = (glw::GLuint)i;
	}

	gl.bufferData(GL_ATOMIC_COUNTER_BUFFER, buffer_data_size, &buffer_data[0], GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed.");

	gl.bindBufferBase(GL_ATOMIC_COUNTER_BUFFER, binding, buffer_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() failed.");

	/* Run program */
	if (TestCaseBase<API>::COMPUTE_SHADER_TYPE != tested_shader_type)
	{
		glw::GLuint framebuffer_object_id = 0;
		glw::GLuint texture_object_id	 = 0;
		glw::GLuint vao_id				  = 0;

		gl.genTextures(1, &texture_object_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() failed.");

		gl.bindTexture(GL_TEXTURE_2D, texture_object_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() failed.");

		gl.texStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 1, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() failed.");

		gl.genFramebuffers(1, &framebuffer_object_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers() failed.");

		gl.bindFramebuffer(GL_FRAMEBUFFER, framebuffer_object_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() failed.");

		gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, texture_object_id, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() failed.");

		gl.viewport(0, 0, 1, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport() failed.");

		gl.genVertexArrays(1, &vao_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() failed.");

		gl.bindVertexArray(vao_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() failed.");

		switch (tested_shader_type)
		{
		case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
		case TestCaseBase<API>::VERTEX_SHADER_TYPE: /* Fall through */
		case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
			gl.drawArrays(GL_POINTS, 0, 1);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed.");
			break;

		case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE: /* Fall through */
		case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
			/* Tesselation patch set up */
			gl.patchParameteri(GL_PATCH_VERTICES, 1);
			GLU_EXPECT_NO_ERROR(gl.getError(), "PatchParameteri");

			gl.drawArrays(GL_PATCHES, 0, 1);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed.");
			break;

		default:
			TCU_FAIL("Invalid enum");
			break;
		}

		gl.memoryBarrier(GL_ALL_BARRIER_BITS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "MemoryBarrier.");

		gl.bindTexture(GL_TEXTURE_2D, 0);
		gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
		gl.bindVertexArray(0);
		gl.deleteTextures(1, &texture_object_id);
		gl.deleteFramebuffers(1, &framebuffer_object_id);
		gl.deleteVertexArrays(1, &vao_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "An error ocurred while deleting generated objects.");
	}
	else
	{
		gl.dispatchCompute(1, 1, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed.");

		gl.memoryBarrier(GL_ALL_BARRIER_BITS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "MemoryBarrier.");
	}

	/* Verify results */
	bool test_result = true;

	const glw::GLuint* results =
		(glw::GLuint*)gl.mapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0 /* offset */, buffer_data_size, GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MapBufferRange");

	/* Anything before start position should be 0 */
	for (size_t i = 0; i < start_pos; ++i)
	{
		if (0 != results[i])
		{
			test_result = false;
			break;
		}
	}

	/* Anything from start_pos should be incremented by 1 */
	int diff = 0;
	for (size_t i = 0; i < n_entries; ++i)
	{
		/* Tesselation evaluation can be called several times
		 In here, check the increment is consistent over all results.
		 */
		if (tested_shader_type == TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE)
		{
			if (i == 0)
			{
				diff = static_cast<int>(results[i + start_pos]) - static_cast<int>(i);
				if (diff <= 0)
				{
					test_result = false;
					break;
				}
			}
			else if ((static_cast<int>(results[i + start_pos]) - static_cast<int>(i)) != diff)
			{
				test_result = false;
				break;
			}
		}
		else
		{
			if (i + 1 != results[i + start_pos])
			{
				test_result = false;
				break;
			}
		}
	}

	gl.unmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UnmapBuffer");

	/* Deallocate any resources used. */
	gl.deleteBuffers(1, &buffer_object_id);
	this->delete_objects();

	if (false == test_result)
	{
		TCU_FAIL("Invalid results.");
	}
}